

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O0

rar_filter *
create_filter(rar_program_code *prog,uint8_t *globaldata,uint32_t globaldatalen,uint32_t *registers,
             size_t startpos,uint32_t length)

{
  long lVar1;
  uint32_t uVar2;
  void *pvVar3;
  uint32_t local_4c;
  rar_filter *filter;
  uint32_t length_local;
  size_t startpos_local;
  uint32_t *registers_local;
  uint32_t globaldatalen_local;
  uint8_t *globaldata_local;
  rar_program_code *prog_local;
  
  prog_local = (rar_program_code *)calloc(1,0x58);
  if (prog_local == (rar_program_code *)0x0) {
    prog_local = (rar_program_code *)0x0;
  }
  else {
    prog_local->staticdata = (uint8_t *)prog;
    local_4c = globaldatalen;
    if (globaldatalen < 0x41) {
      local_4c = 0x40;
    }
    *(uint32_t *)&prog_local->next = local_4c;
    pvVar3 = calloc(1,(ulong)*(uint *)&prog_local->next);
    *(void **)&prog_local->usagecount = pvVar3;
    lVar1._0_4_ = prog_local->usagecount;
    lVar1._4_4_ = prog_local->oldfilterlength;
    if (lVar1 == 0) {
      prog_local = (rar_program_code *)0x0;
    }
    else {
      if (globaldata != (uint8_t *)0x0) {
        memcpy(*(void **)&prog_local->usagecount,globaldata,(ulong)globaldatalen);
      }
      if (registers != (uint32_t *)0x0) {
        uVar2 = registers[1];
        prog_local->staticdatalen = registers[0];
        *(uint32_t *)&prog_local->field_0xc = uVar2;
        prog_local->globalbackup = *(uint8_t **)(registers + 2);
        uVar2 = registers[5];
        prog_local->globalbackuplen = registers[4];
        *(uint32_t *)&prog_local->field_0x1c = uVar2;
        prog_local->fingerprint = *(uint64_t *)(registers + 6);
      }
      prog_local[1].staticdata = (uint8_t *)startpos;
      prog_local[1].staticdatalen = length;
    }
  }
  return (rar_filter *)prog_local;
}

Assistant:

static struct rar_filter *
create_filter(struct rar_program_code *prog, const uint8_t *globaldata, uint32_t globaldatalen, uint32_t registers[8], size_t startpos, uint32_t length)
{
  struct rar_filter *filter;

  filter = calloc(1, sizeof(*filter));
  if (!filter)
    return NULL;
  filter->prog = prog;
  filter->globaldatalen = globaldatalen > PROGRAM_SYSTEM_GLOBAL_SIZE ? globaldatalen : PROGRAM_SYSTEM_GLOBAL_SIZE;
  filter->globaldata = calloc(1, filter->globaldatalen);
  if (!filter->globaldata)
    return NULL;
  if (globaldata)
    memcpy(filter->globaldata, globaldata, globaldatalen);
  if (registers)
    memcpy(filter->initialregisters, registers, sizeof(filter->initialregisters));
  filter->blockstartpos = startpos;
  filter->blocklength = length;

  return filter;
}